

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

char * __thiscall
cmMakefile::ExpandVariablesInString
          (cmMakefile *this,string *source,bool escapeQuotes,bool noEscapes,bool atOnly,
          char *filename,long line,bool removeEmpty,bool replaceAt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  PolicyStatus PVar3;
  MessageType MVar4;
  int iVar5;
  size_type extraout_RDX;
  size_type sVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  string newResult;
  string msg;
  string msg_new;
  string newErrorstr;
  string original;
  string errorstr;
  string msg_old;
  string msg_input;
  
  errorstr._M_dataplus._M_p = (pointer)&errorstr.field_2;
  errorstr._M_string_length = 0;
  errorstr.field_2._M_local_buf[0] = '\0';
  original._M_dataplus._M_p = (pointer)&original.field_2;
  original._M_string_length = 0;
  original.field_2._M_local_buf[0] = '\0';
  paVar1 = &newResult.field_2;
  newResult._M_dataplus._M_p = (pointer)paVar1;
  if ((!noEscapes || !removeEmpty) && atOnly) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&newResult,
               "ExpandVariablesInString @ONLY called on something with escapes.","");
    IssueMessage(this,INTERNAL_ERROR,&newResult);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)newResult._M_dataplus._M_p != paVar1) {
      operator_delete(newResult._M_dataplus._M_p,
                      CONCAT71(newResult.field_2._M_allocated_capacity._1_7_,
                               newResult.field_2._M_local_buf[0]) + 1);
    }
    pcVar7 = (source->_M_dataplus)._M_p;
    goto LAB_00368a4a;
  }
  newResult._M_string_length = 0;
  newResult.field_2._M_local_buf[0] = '\0';
  newErrorstr._M_dataplus._M_p = (pointer)&newErrorstr.field_2;
  newErrorstr._M_string_length = 0;
  newErrorstr.field_2._M_local_buf[0] = '\0';
  PVar3 = GetPolicyStatus(this,CMP0053);
  if (PVar3 - NEW < 3) {
    MVar4 = ExpandVariablesInStringNew
                      (this,&errorstr,source,escapeQuotes,noEscapes,atOnly,filename,line,removeEmpty
                       ,replaceAt);
    bVar8 = true;
    bVar9 = false;
LAB_003686f5:
    if (MVar4 == LOG) {
      if (bVar9) {
        sVar6 = newResult._M_string_length;
        if (newResult._M_string_length == source->_M_string_length) {
          if (newResult._M_string_length == 0) {
            bVar9 = false;
          }
          else {
            iVar5 = bcmp(newResult._M_dataplus._M_p,(source->_M_dataplus)._M_p,
                         newResult._M_string_length);
            bVar9 = iVar5 != 0;
            sVar6 = extraout_RDX;
          }
          if ((!bVar9) && (bVar8)) goto LAB_00368a04;
        }
        cmPolicies::GetPolicyWarning_abi_cxx11_(&msg,(cmPolicies *)0x35,(PolicyID)sVar6);
        std::__cxx11::string::append((char *)&msg);
        msg_input._M_dataplus._M_p = (pointer)&msg_input.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&msg_input,original._M_dataplus._M_p,
                   original._M_dataplus._M_p + original._M_string_length);
        cmsys::SystemTools::ReplaceString(&msg_input,"\n","\n  ");
        std::__cxx11::string::append((char *)&msg);
        std::__cxx11::string::_M_append((char *)&msg,(ulong)msg_input._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&msg);
        pcVar2 = (source->_M_dataplus)._M_p;
        msg_old._M_dataplus._M_p = (pointer)&msg_old.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&msg_old,pcVar2,pcVar2 + source->_M_string_length);
        cmsys::SystemTools::ReplaceString(&msg_old,"\n","\n  ");
        std::__cxx11::string::append((char *)&msg);
        std::__cxx11::string::_M_append((char *)&msg,(ulong)msg_old._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&msg);
        if (bVar8) {
          msg_new._M_dataplus._M_p = (pointer)&msg_new.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&msg_new,newResult._M_dataplus._M_p,
                     newResult._M_dataplus._M_p + newResult._M_string_length);
          cmsys::SystemTools::ReplaceString(&msg_new,"\n","\n  ");
          std::__cxx11::string::append((char *)&msg);
          std::__cxx11::string::_M_append((char *)&msg,(ulong)msg_new._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&msg);
        }
        else {
          msg_new._M_dataplus._M_p = (pointer)&msg_new.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&msg_new,newErrorstr._M_dataplus._M_p,
                     newErrorstr._M_dataplus._M_p + newErrorstr._M_string_length);
          cmsys::SystemTools::ReplaceString(&msg_new,"\n","\n  ");
          std::__cxx11::string::append((char *)&msg);
          std::__cxx11::string::_M_append((char *)&msg,(ulong)msg_new._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&msg);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg_new._M_dataplus._M_p != &msg_new.field_2) {
          operator_delete(msg_new._M_dataplus._M_p,msg_new.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&msg);
        IssueMessage(this,AUTHOR_WARNING,&msg);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg_old._M_dataplus._M_p != &msg_old.field_2) {
          operator_delete(msg_old._M_dataplus._M_p,msg_old.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg_input._M_dataplus._M_p != &msg_input.field_2) {
          operator_delete(msg_input._M_dataplus._M_p,msg_input.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else {
      if (MVar4 == FATAL_ERROR) {
        cmSystemTools::s_FatalErrorOccured = true;
      }
      IssueMessage(this,MVar4,&errorstr);
    }
  }
  else {
    if (PVar3 == OLD) {
      bVar8 = true;
      bVar9 = false;
LAB_003686c4:
      MVar4 = ExpandVariablesInStringOld
                        (this,&errorstr,source,escapeQuotes,noEscapes,atOnly,filename,line,
                         removeEmpty,true);
      goto LAB_003686f5;
    }
    if (PVar3 == WARN) {
      std::__cxx11::string::_M_assign((string *)&original);
      std::__cxx11::string::_M_assign((string *)&newResult);
      this->SuppressWatches = true;
      MVar4 = ExpandVariablesInStringNew
                        (this,&newErrorstr,&newResult,escapeQuotes,noEscapes,atOnly,filename,line,
                         removeEmpty,replaceAt);
      this->SuppressWatches = false;
      bVar8 = MVar4 == LOG;
      bVar9 = true;
      goto LAB_003686c4;
    }
  }
LAB_00368a04:
  pcVar7 = (source->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)newErrorstr._M_dataplus._M_p != &newErrorstr.field_2) {
    operator_delete(newErrorstr._M_dataplus._M_p,
                    CONCAT71(newErrorstr.field_2._M_allocated_capacity._1_7_,
                             newErrorstr.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)newResult._M_dataplus._M_p != &newResult.field_2) {
    operator_delete(newResult._M_dataplus._M_p,
                    CONCAT71(newResult.field_2._M_allocated_capacity._1_7_,
                             newResult.field_2._M_local_buf[0]) + 1);
  }
LAB_00368a4a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)original._M_dataplus._M_p != &original.field_2) {
    operator_delete(original._M_dataplus._M_p,
                    CONCAT71(original.field_2._M_allocated_capacity._1_7_,
                             original.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)errorstr._M_dataplus._M_p != &errorstr.field_2) {
    operator_delete(errorstr._M_dataplus._M_p,
                    CONCAT71(errorstr.field_2._M_allocated_capacity._1_7_,
                             errorstr.field_2._M_local_buf[0]) + 1);
  }
  return pcVar7;
}

Assistant:

const char *cmMakefile::ExpandVariablesInString(std::string& source,
                                                bool escapeQuotes,
                                                bool noEscapes,
                                                bool atOnly,
                                                const char* filename,
                                                long line,
                                                bool removeEmpty,
                                                bool replaceAt) const
{
  bool compareResults = false;
  cmake::MessageType mtype = cmake::LOG;
  std::string errorstr;
  std::string original;

  // Sanity check the @ONLY mode.
  if(atOnly && (!noEscapes || !removeEmpty))
    {
    // This case should never be called.  At-only is for
    // configure-file/string which always does no escapes.
    this->IssueMessage(cmake::INTERNAL_ERROR,
                       "ExpandVariablesInString @ONLY called "
                       "on something with escapes.");
    return source.c_str();
    }

  // Variables used in the WARN case.
  std::string newResult;
  std::string newErrorstr;
  cmake::MessageType newError = cmake::LOG;

  switch(this->GetPolicyStatus(cmPolicies::CMP0053))
    {
    case cmPolicies::WARN:
      {
      // Save the original string for the warning.
      original = source;
      newResult = source;
      compareResults = true;
      // Suppress variable watches to avoid calling hooks twice. Suppress new
      // dereferences since the OLD behavior is still what is actually used.
      this->SuppressWatches = true;
      newError =
        ExpandVariablesInStringNew(newErrorstr, newResult, escapeQuotes,
                                   noEscapes, atOnly, filename, line,
                                   removeEmpty, replaceAt);
      this->SuppressWatches = false;
      }
    case cmPolicies::OLD:
      mtype = ExpandVariablesInStringOld(errorstr, source, escapeQuotes,
                                         noEscapes, atOnly, filename,
                                         line, removeEmpty, true);
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      // Messaging here would be *very* verbose.
    case cmPolicies::NEW:
      mtype = ExpandVariablesInStringNew(errorstr, source, escapeQuotes,
                                         noEscapes, atOnly, filename,
                                         line, removeEmpty, replaceAt);
      break;
    }

  // If it's an error in either case, just report the error...
  if(mtype != cmake::LOG)
    {
    if(mtype == cmake::FATAL_ERROR)
      {
      cmSystemTools::SetFatalErrorOccured();
      }
    this->IssueMessage(mtype, errorstr);
    }
  // ...otherwise, see if there's a difference that needs to be warned about.
  else if(compareResults && (newResult != source || newError != mtype))
    {
    std::string msg =
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0053);
    msg += "\n";

    std::string msg_input = original;
    cmSystemTools::ReplaceString(msg_input, "\n", "\n  ");
    msg += "For input:\n  '";
    msg += msg_input;
    msg += "'\n";

    std::string msg_old = source;
    cmSystemTools::ReplaceString(msg_old, "\n", "\n  ");
    msg += "the old evaluation rules produce:\n  '";
    msg += msg_old;
    msg += "'\n";

    if(newError == mtype)
      {
      std::string msg_new = newResult;
      cmSystemTools::ReplaceString(msg_new, "\n", "\n  ");
      msg += "but the new evaluation rules produce:\n  '";
      msg += msg_new;
      msg += "'\n";
      }
    else
      {
      std::string msg_err = newErrorstr;
      cmSystemTools::ReplaceString(msg_err, "\n", "\n  ");
      msg += "but the new evaluation rules produce an error:\n  ";
      msg += msg_err;
      msg += "\n";
      }

    msg +=
      "Using the old result for compatibility since the policy is not set.";

    this->IssueMessage(cmake::AUTHOR_WARNING, msg);
    }

  return source.c_str();
}